

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O2

enable_if_t<_std::is_same<std::decay_t<const_char_(&)[14]>,_variant<int,_basic_string<char>_>_>::value>
 __thiscall
Catch::Generators::Generators<std::variant<int,std::__cxx11::string>>::
add_generator<char_const(&)[14]>
          (Generators<std::variant<int,std::__cxx11::string>> *this,char (*val) [14])

{
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  
  std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
  _Variant_storage<1ul,char_const(&)[14]>
            ((_Variant_storage<false,int,std::__cxx11::string> *)&_Stack_38);
  Generators<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::add_generator((Generators<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,(variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&_Stack_38);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&_Stack_38);
  return;
}

Assistant:

std::enable_if_t<!std::is_same<std::decay_t<U>, T>::value>
        add_generator( U&& val ) {
            add_generator( T( CATCH_FORWARD( val ) ) );
        }